

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O0

StringStream<char> * __thiscall
Qentem::StringStream<char>::operator=(StringStream<char> *this,char *str)

{
  uint uVar1;
  size_t in_RCX;
  char *str_local;
  StringStream<char> *this_local;
  
  Clear(this);
  uVar1 = StringUtils::Count<char,unsigned_int>(str);
  write(this,(int)str,(void *)(ulong)uVar1,in_RCX);
  return this;
}

Assistant:

StringStream &operator=(const Char_T *str) {
        Clear();
        write(str, StringUtils::Count(str));

        return *this;
    }